

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

void __thiscall notch::io::NetSpec::NetSpec(NetSpec *this,Net *net)

{
  LayerSpec *this_00;
  ulong uVar1;
  shared_ptr<const_notch::core::ALossLayer> lossLayer;
  LayerSpec spec;
  undefined1 local_a8 [56];
  size_t local_70;
  size_t local_68;
  
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  (this->tag)._M_string_length = 0;
  (this->tag).field_2._M_local_buf[0] = '\0';
  this->inputDim = 0;
  this->outputDim = 0;
  (this->layers).super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->layers).super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->layers).
           super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->layers).
           super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  std::__cxx11::string::assign((char *)this);
  local_a8._16_8_ = &this->inputDim;
  this_00 = (LayerSpec *)(local_a8 + 0x18);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(net->layers).
                            super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(net->layers).
                            super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar1 = uVar1 + 1) {
    core::Net::getLayer((Net *)local_a8,(size_t)net);
    if ((ABackpropLayer *)local_a8._0_8_ != (ABackpropLayer *)0x0) {
      LayerSpec::LayerSpec(this_00,(ABackpropLayer *)local_a8._0_8_);
      core::std::vector<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>::push_back
                (&this->layers,this_00);
      if (uVar1 == 0) {
        *(size_t *)local_a8._16_8_ = local_70;
      }
      this->outputDim = local_68;
      LayerSpec::~LayerSpec(this_00);
    }
    core::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  }
  std::__shared_ptr<notch::core::ALossLayer_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<notch::core::ALossLayer,void>
            ((__shared_ptr<notch::core::ALossLayer_const,(__gnu_cxx::_Lock_policy)2> *)local_a8,
             &(net->lossLayer).
              super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>);
  if ((ABackpropLayer *)local_a8._0_8_ != (ABackpropLayer *)0x0) {
    LayerSpec::LayerSpec((LayerSpec *)(local_a8 + 0x18),(ALossLayer *)local_a8._0_8_);
    core::std::vector<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>::
    emplace_back<notch::io::LayerSpec>(&this->layers,(LayerSpec *)(local_a8 + 0x18));
    LayerSpec::~LayerSpec((LayerSpec *)(local_a8 + 0x18));
    this->hasLoss = true;
  }
  core::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  return;
}

Assistant:

NetSpec(const Net &net) {
        this->tag = "Net";
        for (size_t i = 0; i < net.size(); ++i) {
            auto layer = net.getLayer(i);
            if (layer) {
                auto spec = LayerSpec(*layer);
                layers.push_back(spec);
                if (i == 0) {
                    inputDim = spec.inputDim;
                }
                outputDim =spec.outputDim;
            }
        }
        auto lossLayer = net.getLossLayer();
        if (lossLayer) {
            layers.push_back(LayerSpec(*lossLayer));
            hasLoss = true;
        }
    }